

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O1

UBool __thiscall
icu_63::FractionalPartSubstitution::doParse
          (FractionalPartSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double param_4,UBool lenientParse,uint32_t nonNumericalExecutedRuleMask,
          Formattable *resVal)

{
  FractionalPartSubstitution *pFVar1;
  UBool UVar2;
  int8_t value;
  undefined4 uVar3;
  uint uVar5;
  undefined7 in_register_00000009;
  undefined8 uVar6;
  NumberFormat *pNVar7;
  double dVar8;
  double d;
  UErrorCode status;
  ParsePosition workPos;
  UnicodeString workText;
  DecimalQuantity dl;
  Formattable temp;
  UErrorCode local_16c;
  ParsePosition local_168;
  ulong local_158;
  undefined4 local_150;
  uint32_t local_14c;
  FractionalPartSubstitution *local_148;
  Formattable *local_140;
  double local_138;
  UnicodeString local_130;
  DecimalQuantity local_f0;
  Formattable local_a0;
  int32_t iVar4;
  
  if (this->byDigits == '\0') {
    UVar2 = NFSubstitution::doParse
                      (&this->super_NFSubstitution,text,parsePosition,baseValue,0.0,lenientParse,
                       nonNumericalExecutedRuleMask,resVal);
    return UVar2;
  }
  local_138 = baseValue;
  UnicodeString::UnicodeString(&local_130,text);
  local_168.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003dc090;
  local_168.index = 1;
  local_168.errorIndex = -1;
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&local_f0);
  uVar3 = local_130.fUnion.fFields.fLength;
  if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
    uVar3 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  local_158 = 0;
  local_148 = this;
  local_140 = resVal;
  if ((int)uVar3 < 1) {
    pNVar7 = (NumberFormat *)0x0;
  }
  else {
    local_150 = (undefined4)CONCAT71(in_register_00000009,lenientParse);
    pNVar7 = (NumberFormat *)0x0;
    local_14c = nonNumericalExecutedRuleMask;
    if (local_168.index != 0) {
      pNVar7 = (NumberFormat *)0x0;
      local_158 = 0;
      do {
        local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
        Formattable::Formattable(&local_a0);
        NFRuleSet::parse((local_148->super_NFSubstitution).ruleSet,&local_130,&local_168,10.0,
                         local_14c,&local_a0);
        local_16c = U_ZERO_ERROR;
        iVar4 = Formattable::getLong(&local_a0,&local_16c);
        value = (int8_t)iVar4;
        if (((char)local_150 != '\0') && (local_168.index == 0)) {
          if (pNVar7 == (NumberFormat *)0x0) {
            local_16c = U_ZERO_ERROR;
            pNVar7 = NumberFormat::createInstance(&local_16c);
            if (U_ZERO_ERROR < local_16c) {
              if (pNVar7 != (NumberFormat *)0x0) {
                (*(pNVar7->super_Format).super_UObject._vptr_UObject[1])(pNVar7);
              }
              pNVar7 = (NumberFormat *)0x0;
            }
          }
          if (pNVar7 == (NumberFormat *)0x0) {
            pNVar7 = (NumberFormat *)0x0;
          }
          else {
            (*(pNVar7->super_Format).super_UObject._vptr_UObject[0x14])
                      (pNVar7,&local_130,&local_a0,&local_168);
            iVar4 = Formattable::getLong(&local_a0,&local_16c);
            value = (int8_t)iVar4;
          }
        }
        if (local_168.index != 0) {
          icu_63::number::impl::DecimalQuantity::appendDigit(&local_f0,value,0,true);
          parsePosition->index = parsePosition->index + local_168.index;
          UnicodeString::doReplace(&local_130,0,local_168.index,(UChar *)0x0,0,0);
          uVar5 = (uint)local_130.fUnion.fStackFields.fLengthAndFlags;
          uVar3 = local_130.fUnion.fFields.fLength;
          if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
            uVar3 = (int)uVar5 >> 5;
          }
          local_158 = (ulong)((int)local_158 + 1);
          while (0 < (int)uVar3) {
            uVar6 = local_130.fUnion.fStackFields.fBuffer;
            if ((uVar5 & 2) == 0) {
              uVar6 = local_130.fUnion.fFields.fArray;
            }
            if (*(char16_t *)uVar6 != L' ') break;
            UnicodeString::doReplace(&local_130,0,1,(UChar *)0x0,0,0);
            parsePosition->index = parsePosition->index + 1;
            uVar5 = (uint)local_130.fUnion.fStackFields.fLengthAndFlags;
            uVar3 = local_130.fUnion.fFields.fLength;
            if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
              uVar3 = (int)uVar5 >> 5;
            }
          }
        }
        Formattable::~Formattable(&local_a0);
        uVar3 = local_130.fUnion.fFields.fLength;
        if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
          uVar3 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
      } while ((0 < (int)uVar3) && (local_168.index != 0));
    }
  }
  if (pNVar7 != (NumberFormat *)0x0) {
    (*(pNVar7->super_Format).super_UObject._vptr_UObject[1])(pNVar7);
  }
  icu_63::number::impl::DecimalQuantity::adjustMagnitude(&local_f0,-(int)local_158);
  pFVar1 = local_148;
  dVar8 = icu_63::number::impl::DecimalQuantity::toDouble(&local_f0);
  (*(pFVar1->super_NFSubstitution).super_UObject._vptr_UObject[0xb])(dVar8,local_138,pFVar1);
  Formattable::setDouble(local_140,d);
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_f0);
  ParsePosition::~ParsePosition(&local_168);
  UnicodeString::~UnicodeString(&local_130);
  return '\x01';
}

Assistant:

UBool
FractionalPartSubstitution::doParse(const UnicodeString& text,
                ParsePosition& parsePosition,
                double baseValue,
                double /*upperBound*/,
                UBool lenientParse,
                uint32_t nonNumericalExecutedRuleMask,
                Formattable& resVal) const
{
    // if we're not in byDigits mode, we can just use the inherited
    // doParse()
    if (!byDigits) {
        return NFSubstitution::doParse(text, parsePosition, baseValue, 0, lenientParse, nonNumericalExecutedRuleMask, resVal);

        // if we ARE in byDigits mode, parse the text one digit at a time
        // using this substitution's owning rule set (we do this by setting
        // upperBound to 10 when calling doParse() ) until we reach
        // nonmatching text
    } else {
        UnicodeString workText(text);
        ParsePosition workPos(1);
        double result = 0;
        int32_t digit;
//          double p10 = 0.1;

        DecimalQuantity dl;
        int32_t totalDigits = 0;
        NumberFormat* fmt = NULL;
        while (workText.length() > 0 && workPos.getIndex() != 0) {
            workPos.setIndex(0);
            Formattable temp;
            getRuleSet()->parse(workText, workPos, 10, nonNumericalExecutedRuleMask, temp);
            UErrorCode status = U_ZERO_ERROR;
            digit = temp.getLong(status);
//            digit = temp.getType() == Formattable::kLong ?
//               temp.getLong() :
//            (int32_t)temp.getDouble();

            if (lenientParse && workPos.getIndex() == 0) {
                if (!fmt) {
                    status = U_ZERO_ERROR;
                    fmt = NumberFormat::createInstance(status);
                    if (U_FAILURE(status)) {
                        delete fmt;
                        fmt = NULL;
                    }
                }
                if (fmt) {
                    fmt->parse(workText, temp, workPos);
                    digit = temp.getLong(status);
                }
            }

            if (workPos.getIndex() != 0) {
                dl.appendDigit(static_cast<int8_t>(digit), 0, true);
                totalDigits++;
//                  result += digit * p10;
//                  p10 /= 10;
                parsePosition.setIndex(parsePosition.getIndex() + workPos.getIndex());
                workText.removeBetween(0, workPos.getIndex());
                while (workText.length() > 0 && workText.charAt(0) == gSpace) {
                    workText.removeBetween(0, 1);
                    parsePosition.setIndex(parsePosition.getIndex() + 1);
                }
            }
        }
        delete fmt;

        dl.adjustMagnitude(-totalDigits);
        result = dl.toDouble();
        result = composeRuleValue(result, baseValue);
        resVal.setDouble(result);
        return TRUE;
    }
}